

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*> *this,size_type newCapacity)

{
  pointer __src;
  pointer __dest;
  
  __dest = (pointer)operator_new(newCapacity * 8);
  __src = this->data_;
  if (this->len != 0) {
    memmove(__dest,__src,this->len << 3);
  }
  if (__src != (pointer)this->firstElement) {
    operator_delete(__src);
  }
  this->cap = newCapacity;
  this->data_ = __dest;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }